

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O3

void finalize_preconditioner<dense_parameters>
               (vw *param_1,bfgs *b,float regularization,dense_parameters *weights)

{
  uint32_t uVar1;
  float fVar2;
  float *pfVar3;
  float *pfVar4;
  uint64_t uVar5;
  long lVar6;
  anon_union_4_2_947300a4 x;
  float fVar7;
  float fVar8;
  
  pfVar3 = weights->_begin;
  if (b->regularizers == (weight *)0x0) {
    uVar5 = weights->_weight_mask;
    if (pfVar3 != pfVar3 + uVar5 + 1) {
      uVar1 = weights->_stride_shift;
      fVar8 = 0.0;
      do {
        fVar7 = pfVar3[3] + regularization;
        fVar2 = fVar7;
        if (fVar7 <= fVar8) {
          fVar2 = fVar8;
        }
        fVar8 = fVar2;
        pfVar3[3] = (float)(~-(uint)(0.0 < fVar7) & (uint)fVar7 |
                           (uint)(1.0 / fVar7) & -(uint)(0.0 < fVar7));
        pfVar4 = weights->_begin;
        uVar5 = weights->_weight_mask;
        pfVar3 = pfVar3 + (1L << ((byte)uVar1 & 0x3f));
      } while (pfVar3 != pfVar4 + uVar5 + 1);
      goto LAB_001a8ba2;
    }
  }
  else {
    uVar5 = weights->_weight_mask;
    if (pfVar3 != pfVar3 + uVar5 + 1) {
      uVar1 = weights->_stride_shift;
      fVar8 = 0.0;
      lVar6 = 0;
      do {
        fVar7 = b->regularizers[((ulong)(lVar6 >> 2) >> ((byte)weights->_stride_shift & 0x3f)) * 2]
                + *(float *)((long)pfVar3 + lVar6 + 0xc);
        fVar2 = fVar7;
        if (fVar7 <= fVar8) {
          fVar2 = fVar8;
        }
        fVar8 = fVar2;
        *(uint *)((long)pfVar3 + lVar6 + 0xc) =
             ~-(uint)(0.0 < fVar7) & (uint)fVar7 | (uint)(1.0 / fVar7) & -(uint)(0.0 < fVar7);
        pfVar4 = weights->_begin;
        uVar5 = weights->_weight_mask;
        lVar6 = lVar6 + (1L << ((byte)uVar1 & 0x3f)) * 4;
      } while ((float *)((long)pfVar3 + lVar6) != pfVar4 + uVar5 + 1);
      goto LAB_001a8ba2;
    }
  }
  fVar8 = 0.0;
  pfVar4 = pfVar3;
LAB_001a8ba2:
  if (pfVar4 != pfVar4 + uVar5 + 1) {
    uVar1 = weights->_stride_shift;
    fVar8 = (float)(~-(uint)(fVar8 == 0.0) & (uint)(10000.0 / fVar8));
    pfVar3 = pfVar4;
    do {
      if ((((uint)*pfVar3 & 0x7fc00000) == 0x7f800000) || (fVar8 < *pfVar3)) {
        pfVar3[3] = fVar8;
        pfVar4 = weights->_begin;
        uVar5 = weights->_weight_mask;
      }
      pfVar3 = pfVar3 + (1L << ((byte)uVar1 & 0x3f));
    } while (pfVar3 != pfVar4 + uVar5 + 1);
  }
  return;
}

Assistant:

void finalize_preconditioner(vw& /* all */, bfgs& b, float regularization, T& weights)
{
  float max_hessian = 0.f;

  if (b.regularizers == nullptr)
    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      (&(*w))[W_COND] += regularization;
      if ((&(*w))[W_COND] > max_hessian)
        max_hessian = (&(*w))[W_COND];
      if ((&(*w))[W_COND] > 0)
        (&(*w))[W_COND] = 1.f / (&(*w))[W_COND];
    }
  else
    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      (&(*w))[W_COND] += b.regularizers[2 * (w.index() >> weights.stride_shift())];
      if ((&(*w))[W_COND] > max_hessian)
        max_hessian = (&(*w))[W_COND];
      if ((&(*w))[W_COND] > 0)
        (&(*w))[W_COND] = 1.f / (&(*w))[W_COND];
    }

  float max_precond = (max_hessian == 0.f) ? 0.f : max_precond_ratio / max_hessian;

  for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
  {
    if (infpattern(*w) || *w > max_precond)
      (&(*w))[W_COND] = max_precond;
  }
}